

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm_info.cc
# Opt level: O1

bool anon_unknown.dwarf_68f6::OutputCues
               (Segment *segment,Tracks *tracks,Options *options,FILE *o,Indent *indent)

{
  pointer pcVar1;
  undefined1 *puVar2;
  FILE *__stream;
  bool bVar3;
  uint uVar4;
  Cues *this;
  CuePoint *this_00;
  unsigned_long uVar5;
  Track *pTrack;
  TrackPosition *pTVar6;
  long lVar7;
  ulong uVar8;
  longlong lVar9;
  Cues *extraout_RAX;
  Cues *extraout_RAX_00;
  undefined8 uVar10;
  uint local_94;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  Cues *local_68;
  unsigned_long local_60;
  FILE *local_58;
  Segment *local_50;
  CuePoint *local_48;
  unsigned_long local_40;
  TrackPosition *local_38;
  
  local_50 = segment;
  this = mkvparser::Segment::GetCues(segment);
  if (this != (Cues *)0x0) {
    while (bVar3 = mkvparser::Cues::DoneParsing(this), !bVar3) {
      mkvparser::Cues::LoadCuePoint(this);
    }
    this_00 = mkvparser::Cues::GetFirst(this);
    if (this_00 == (CuePoint *)0x0) {
      pcVar1 = (indent->indent_str_)._M_dataplus._M_p;
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,pcVar1,pcVar1 + (indent->indent_str_)._M_string_length);
      uVar4 = fprintf((FILE *)o,"%sNo cue points.\n",local_88[0]);
      this = (Cues *)(ulong)uVar4;
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
        this = extraout_RAX_00;
      }
    }
    else {
      pcVar1 = (indent->indent_str_)._M_dataplus._M_p;
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,pcVar1,pcVar1 + (indent->indent_str_)._M_string_length);
      fprintf((FILE *)o,"%sCues:",local_88[0]);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
      if (options->output_offset == true) {
        fprintf((FILE *)o," @:%lld",this->m_element_start);
      }
      if (options->output_size == true) {
        fprintf((FILE *)o," size:%lld",this->m_element_size);
      }
      local_58 = (FILE *)o;
      fputc(10,(FILE *)o);
      uVar5 = mkvparser::Tracks::GetTracksCount(tracks);
      libwebm::Indent::Adjust(indent,2);
      local_40 = (unsigned_long)((uint)uVar5 & 0x7fffffff);
      local_94 = 1;
      local_68 = this;
      local_60 = uVar5;
      do {
        if (0 < (int)local_60) {
          uVar5 = 0;
          local_48 = this_00;
          do {
            pTrack = mkvparser::Tracks::GetTrackByIndex(tracks,uVar5);
            pTVar6 = mkvparser::CuePoint::Find(this_00,pTrack);
            if (pTVar6 != (TrackPosition *)0x0) {
              local_38 = pTVar6;
              lVar7 = mkvparser::Track::GetType(pTrack);
              pcVar1 = (indent->indent_str_)._M_dataplus._M_p;
              local_88[0] = local_78;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_88,pcVar1,pcVar1 + (indent->indent_str_)._M_string_length);
              puVar2 = local_88[0];
              uVar8 = mkvparser::Track::GetNumber(pTrack);
              __stream = local_58;
              uVar10 = 0x41;
              if (lVar7 == 1) {
                uVar10 = 0x56;
              }
              fprintf(local_58,"%sCue Point:%d type:%c track:%d",puVar2,(ulong)local_94,uVar10,
                      uVar8 & 0xffffffff);
              if (local_88[0] != local_78) {
                operator_delete(local_88[0]);
              }
              this_00 = local_48;
              bVar3 = options->output_seconds;
              lVar9 = mkvparser::CuePoint::GetTime(local_48,local_50);
              pTVar6 = local_38;
              if (bVar3 == true) {
                fprintf(__stream," secs:%g",(double)lVar9 / 1000000000.0);
              }
              else {
                fprintf(__stream," nano:%lld",lVar9);
              }
              if (options->output_blocks == true) {
                fprintf(__stream," block:%lld",pTVar6->m_block);
              }
              if (options->output_offset == true) {
                fprintf(__stream," @:%lld",pTVar6->m_pos);
              }
              fputc(10,__stream);
            }
            uVar5 = uVar5 + 1;
          } while (local_40 != uVar5);
        }
        this_00 = mkvparser::Cues::GetNext(local_68,this_00);
        local_94 = local_94 + 1;
      } while (this_00 != (CuePoint *)0x0);
      libwebm::Indent::Adjust(indent,-2);
      this = extraout_RAX;
    }
  }
  return SUB81(this,0);
}

Assistant:

bool OutputCues(const mkvparser::Segment& segment,
                const mkvparser::Tracks& tracks, const Options& options,
                FILE* o, Indent* indent) {
  const mkvparser::Cues* const cues = segment.GetCues();
  if (cues == NULL)
    return true;

  // Load all of the cue points.
  while (!cues->DoneParsing())
    cues->LoadCuePoint();

  // Confirm that the input has cue points.
  const mkvparser::CuePoint* const first_cue = cues->GetFirst();
  if (first_cue == NULL) {
    fprintf(o, "%sNo cue points.\n", indent->indent_str().c_str());
    return true;
  }

  // Input has cue points, dump them:
  fprintf(o, "%sCues:", indent->indent_str().c_str());
  if (options.output_offset)
    fprintf(o, " @:%lld", cues->m_element_start);
  if (options.output_size)
    fprintf(o, " size:%lld", cues->m_element_size);
  fprintf(o, "\n");

  const mkvparser::CuePoint* cue_point = first_cue;
  int cue_point_num = 1;
  const int num_tracks = static_cast<int>(tracks.GetTracksCount());
  indent->Adjust(libwebm::kIncreaseIndent);

  do {
    for (int track_num = 0; track_num < num_tracks; ++track_num) {
      const mkvparser::Track* const track = tracks.GetTrackByIndex(track_num);
      const mkvparser::CuePoint::TrackPosition* const track_pos =
          cue_point->Find(track);

      if (track_pos != NULL) {
        const char track_type =
            (track->GetType() == mkvparser::Track::kVideo) ? 'V' : 'A';
        fprintf(o, "%sCue Point:%d type:%c track:%d",
                indent->indent_str().c_str(), cue_point_num, track_type,
                static_cast<int>(track->GetNumber()));

        if (options.output_seconds) {
          fprintf(o, " secs:%g",
                  cue_point->GetTime(&segment) / kNanosecondsPerSecond);
        } else {
          fprintf(o, " nano:%lld", cue_point->GetTime(&segment));
        }

        if (options.output_blocks)
          fprintf(o, " block:%lld", track_pos->m_block);

        if (options.output_offset)
          fprintf(o, " @:%lld", track_pos->m_pos);

        fprintf(o, "\n");
      }
    }

    cue_point = cues->GetNext(cue_point);
    ++cue_point_num;
  } while (cue_point != NULL);

  indent->Adjust(libwebm::kDecreaseIndent);
  return true;
}